

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::ConvertImageVariableToSampledImage
          (ConvertToSampledImagePass *this,Instruction *image_variable,
          uint32_t sampled_image_type_id)

{
  IRContext *pIVar1;
  StorageClass storage_class;
  uint32_t type_id;
  Type *pTVar2;
  bool bVar3;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  pTVar2 = analysis::TypeManager::GetType
                     ((pIVar1->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,sampled_image_type_id);
  if (pTVar2 == (Type *)0x0) {
    bVar3 = false;
  }
  else {
    storage_class = GetStorageClass(this,image_variable);
    bVar3 = storage_class != Max;
    if (bVar3) {
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
        IRContext::BuildTypeManager(pIVar1);
      }
      type_id = analysis::TypeManager::FindPointerToType
                          ((pIVar1->type_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                           _M_head_impl,sampled_image_type_id,storage_class);
      MoveInstructionNextToType(this,image_variable,type_id);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool ConvertToSampledImagePass::ConvertImageVariableToSampledImage(
    Instruction* image_variable, uint32_t sampled_image_type_id) {
  auto* sampled_image_type =
      context()->get_type_mgr()->GetType(sampled_image_type_id);
  if (sampled_image_type == nullptr) return false;
  auto storage_class = GetStorageClass(*image_variable);
  if (storage_class == spv::StorageClass::Max) return false;
  // Make sure |image_variable| is behind its type i.e., avoid the forward
  // reference.
  uint32_t type_id = context()->get_type_mgr()->FindPointerToType(
      sampled_image_type_id, storage_class);
  MoveInstructionNextToType(image_variable, type_id);
  return true;
}